

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O2

void pzshape::TPZShapePrism::CornerShape
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  
  pdVar4 = pt->fStore;
  dVar1 = *pdVar4;
  dVar2 = pdVar4[1];
  dVar3 = pdVar4[2];
  pdVar4 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar4 = (1.0 - dVar3) * ((1.0 - dVar1) - dVar2) * 0.5;
  dVar1 = *pt->fStore;
  dVar2 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(phi,1,0);
  *pdVar4 = (1.0 - dVar2) * dVar1 * 0.5;
  dVar1 = pt->fStore[1];
  dVar2 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(phi,2,0);
  *pdVar4 = (1.0 - dVar2) * dVar1 * 0.5;
  pdVar4 = pt->fStore;
  dVar1 = *pdVar4;
  dVar2 = pdVar4[1];
  dVar3 = pdVar4[2];
  pdVar4 = TPZFMatrix<double>::operator()(phi,3,0);
  *pdVar4 = (dVar3 + 1.0) * ((1.0 - dVar1) - dVar2) * 0.5;
  dVar1 = *pt->fStore;
  dVar2 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(phi,4,0);
  *pdVar4 = (dVar2 + 1.0) * dVar1 * 0.5;
  dVar1 = pt->fStore[1];
  dVar2 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(phi,5,0);
  *pdVar4 = (dVar2 + 1.0) * dVar1 * 0.5;
  dVar1 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,0,0);
  *pdVar4 = (1.0 - dVar1) * -0.5;
  dVar1 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,1,0);
  *pdVar4 = (1.0 - dVar1) * -0.5;
  dVar1 = *pt->fStore;
  dVar2 = pt->fStore[1];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,2,0);
  *pdVar4 = ((1.0 - dVar1) - dVar2) * -0.5;
  dVar1 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,0,1);
  *pdVar4 = (1.0 - dVar1) * 0.5;
  pdVar4 = TPZFMatrix<double>::operator()(dphi,1,1);
  *pdVar4 = 0.0;
  dVar1 = *pt->fStore;
  pdVar4 = TPZFMatrix<double>::operator()(dphi,2,1);
  *pdVar4 = dVar1 * -0.5;
  pdVar4 = TPZFMatrix<double>::operator()(dphi,0,2);
  *pdVar4 = 0.0;
  dVar1 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,1,2);
  *pdVar4 = (1.0 - dVar1) * 0.5;
  dVar1 = pt->fStore[1];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,2,2);
  *pdVar4 = dVar1 * -0.5;
  dVar1 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,0,3);
  *pdVar4 = (dVar1 + 1.0) * -0.5;
  dVar1 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,1,3);
  *pdVar4 = (dVar1 + 1.0) * -0.5;
  dVar1 = *pt->fStore;
  dVar2 = pt->fStore[1];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,2,3);
  *pdVar4 = ((1.0 - dVar1) - dVar2) * 0.5;
  dVar1 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,0,4);
  *pdVar4 = (dVar1 + 1.0) * 0.5;
  pdVar4 = TPZFMatrix<double>::operator()(dphi,1,4);
  *pdVar4 = 0.0;
  dVar1 = *pt->fStore;
  pdVar4 = TPZFMatrix<double>::operator()(dphi,2,4);
  *pdVar4 = dVar1 * 0.5;
  pdVar4 = TPZFMatrix<double>::operator()(dphi,0,5);
  *pdVar4 = 0.0;
  dVar1 = pt->fStore[2];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,1,5);
  *pdVar4 = (dVar1 + 1.0) * 0.5;
  dVar1 = pt->fStore[1];
  pdVar4 = TPZFMatrix<double>::operator()(dphi,2,5);
  *pdVar4 = dVar1 * 0.5;
  return;
}

Assistant:

void TPZShapePrism::CornerShape(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
		phi(0,0)  = .5*(1.-pt[0]-pt[1])*(1.-pt[2]);
		phi(1,0)  = .5*pt[0]*(1.-pt[2]);
		phi(2,0)  = .5*pt[1]*(1.-pt[2]);
		phi(3,0)  = .5*(1.-pt[0]-pt[1])*(1.+pt[2]);
		phi(4,0)  = .5*pt[0]*(1.+pt[2]);
		phi(5,0)  = .5*pt[1]*(1.+pt[2]);
		
		dphi(0,0) = -.5*(1.-pt[2]);
		dphi(1,0) = -.5*(1.-pt[2]);
		dphi(2,0) = -.5*(1.-pt[0]-pt[1]);
		
		dphi(0,1) =  .5*(1.-pt[2]);
		dphi(1,1) =  .0;
		dphi(2,1) = -.5*pt[0];
		
		dphi(0,2) =  .0;
		dphi(1,2) =  .5*(1.-pt[2]);
		dphi(2,2) = -.5*pt[1];
		
		dphi(0,3) = -.5*(1.+pt[2]);
		dphi(1,3) = -.5*(1.+pt[2]);
		dphi(2,3) =  .5*(1.-pt[0]-pt[1]);
		
		dphi(0,4) =  .5*(1.+pt[2]);
		dphi(1,4) =  .0;
		dphi(2,4) =  .5*pt[0];
		
		dphi(0,5) =  .0;
		dphi(1,5) =  .5*(1.+pt[2]);
		dphi(2,5) =  .5*pt[1];
	}